

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O1

double __thiscall
HighsHessian::objectiveValue(HighsHessian *this,vector<double,_std::allocator<double>_> *solution)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  if (0 < (long)this->dim_) {
    piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = 0.0;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      lVar8 = (long)iVar2;
      dVar1 = pdVar5[lVar7];
      dVar9 = dVar1 * 0.5 * pdVar6[lVar8] * dVar1 + dVar9;
      iVar3 = piVar4[lVar7 + 1];
      if (iVar2 + 1 < iVar3) {
        do {
          dVar9 = dVar9 + pdVar6[lVar8 + 1] * dVar1 *
                          pdVar5[(this->index_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar8 + 1]];
          lVar8 = lVar8 + 1;
        } while (iVar3 + -1 != (int)lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != this->dim_);
    return dVar9;
  }
  return 0.0;
}

Assistant:

double HighsHessian::objectiveValue(const std::vector<double>& solution) const {
  double objective_function_value = 0;
  for (HighsInt iCol = 0; iCol < this->dim_; iCol++) {
    HighsInt iEl = this->start_[iCol];
    assert(this->index_[iEl] == iCol);
    objective_function_value +=
        0.5 * solution[iCol] * this->value_[iEl] * solution[iCol];
    for (HighsInt iEl = this->start_[iCol] + 1; iEl < this->start_[iCol + 1];
         iEl++)
      objective_function_value +=
          solution[iCol] * this->value_[iEl] * solution[this->index_[iEl]];
  }
  return objective_function_value;
}